

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void * tcmalloc::retry_do_memalign(void *arg)

{
  size_t bytes;
  PageHeap *pPVar1;
  Length n;
  Length align_pages;
  Span *pSVar2;
  retry_memalign_data *data;
  void *arg_local;
  Span *span;
  void *local_20;
  
  bytes = *arg;
  span = *(Span **)((long)arg + 8);
  if ((Span *)((long)&span->start + bytes) < span) {
    local_20 = (void *)0x0;
  }
  else {
    pPVar1 = Static::pageheap();
    if (pPVar1 == (PageHeap *)0x0) {
      ThreadCache::InitModule();
    }
    if (span == (Span *)0x0) {
      span = (Span *)0x1;
    }
    pPVar1 = Static::pageheap();
    n = pages((size_t)span);
    align_pages = pages(bytes);
    pSVar2 = PageHeap::NewAligned(pPVar1,n,align_pages);
    if (pSVar2 == (Span *)0x0) {
      local_20 = (void *)0x0;
    }
    else {
      local_20 = (void *)(pSVar2->start << 0xd);
    }
  }
  return local_20;
}

Assistant:

static void *retry_do_memalign(void *arg) {
  retry_memalign_data *data = static_cast<retry_memalign_data *>(arg);
  return do_memalign_pages(data->align, data->size);
}